

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerInitCachedScope(Lowerer *this,Instr *instr)

{
  HelperCallOpnd *newSrc;
  Opnd *newSrc_00;
  
  instr->m_opcode = CallHelper;
  newSrc = IR::HelperCallOpnd::New(HelperOP_InitCachedScope,this->m_func);
  newSrc_00 = IR::Instr::UnlinkSrc1(instr);
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  IR::Instr::SetSrc2(instr,newSrc_00);
  return instr;
}

Assistant:

IR::Instr *
Lowerer::LowerInitCachedScope(IR::Instr* instr)
{
    instr->m_opcode = Js::OpCode::CallHelper;
    IR::HelperCallOpnd *helperOpnd = IR::HelperCallOpnd::New(IR::HelperOP_InitCachedScope, this->m_func);
    IR::Opnd * src1 = instr->UnlinkSrc1();
    instr->SetSrc1(helperOpnd);
    instr->SetSrc2(src1);
    return instr;
}